

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

void DiffTestRecurse<Blob<256>,unsigned_long>
               (pfHash hash,Blob<256> *k1,Blob<256> *k2,unsigned_long *h1,unsigned_long *h2,
               int start,int bitsleft,vector<Blob<256>,_std::allocator<Blob<256>_>_> *diffs)

{
  uint32_t start_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Blob<256> t;
  
  if (start < 0x100) {
    do {
      flipbit(k2,0x20,start);
      (*hash)(k2,0x20,0,h2);
      if (*h1 == *h2) {
        uVar1 = *(uint *)k2->bytes ^ *(uint *)k1->bytes;
        uVar2 = *(uint *)(k2->bytes + 4) ^ *(uint *)(k1->bytes + 4);
        uVar3 = *(uint *)(k2->bytes + 8) ^ *(uint *)(k1->bytes + 8);
        uVar4 = *(uint *)(k2->bytes + 0xc) ^ *(uint *)(k1->bytes + 0xc);
        uVar5 = *(uint *)(k2->bytes + 0x10) ^ *(uint *)(k1->bytes + 0x10);
        uVar6 = *(uint *)(k2->bytes + 0x14) ^ *(uint *)(k1->bytes + 0x14);
        uVar7 = *(uint *)(k2->bytes + 0x18) ^ *(uint *)(k1->bytes + 0x18);
        uVar8 = *(uint *)(k2->bytes + 0x1c) ^ *(uint *)(k1->bytes + 0x1c);
        t.bytes[4] = (char)uVar2;
        t.bytes[5] = (char)(uVar2 >> 8);
        t.bytes[6] = (char)(uVar2 >> 0x10);
        t.bytes[7] = (char)(uVar2 >> 0x18);
        t.bytes[0] = (char)uVar1;
        t.bytes[1] = (char)(uVar1 >> 8);
        t.bytes[2] = (char)(uVar1 >> 0x10);
        t.bytes[3] = (char)(uVar1 >> 0x18);
        t.bytes[0xc] = (char)uVar4;
        t.bytes[0xd] = (char)(uVar4 >> 8);
        t.bytes[0xe] = (char)(uVar4 >> 0x10);
        t.bytes[0xf] = (char)(uVar4 >> 0x18);
        t.bytes[8] = (char)uVar3;
        t.bytes[9] = (char)(uVar3 >> 8);
        t.bytes[10] = (char)(uVar3 >> 0x10);
        t.bytes[0xb] = (char)(uVar3 >> 0x18);
        t.bytes[0x14] = (char)uVar6;
        t.bytes[0x15] = (char)(uVar6 >> 8);
        t.bytes[0x16] = (char)(uVar6 >> 0x10);
        t.bytes[0x17] = (char)(uVar6 >> 0x18);
        t.bytes[0x10] = (char)uVar5;
        t.bytes[0x11] = (char)(uVar5 >> 8);
        t.bytes[0x12] = (char)(uVar5 >> 0x10);
        t.bytes[0x13] = (char)(uVar5 >> 0x18);
        t.bytes[0x1c] = (char)uVar8;
        t.bytes[0x1d] = (char)(uVar8 >> 8);
        t.bytes[0x1e] = (char)(uVar8 >> 0x10);
        t.bytes[0x1f] = (char)(uVar8 >> 0x18);
        t.bytes[0x18] = (char)uVar7;
        t.bytes[0x19] = (char)(uVar7 >> 8);
        t.bytes[0x1a] = (char)(uVar7 >> 0x10);
        t.bytes[0x1b] = (char)(uVar7 >> 0x18);
        std::vector<Blob<256>,std::allocator<Blob<256>>>::emplace_back<Blob<256>>
                  ((vector<Blob<256>,std::allocator<Blob<256>>> *)diffs,&t);
      }
      start_00 = start + 1;
      if (bitsleft + -1 != 0) {
        DiffTestRecurse<Blob<256>,unsigned_long>(hash,k1,k2,h1,h2,start_00,bitsleft + -1,diffs);
      }
      flipbit(k2,0x20,start);
      start = start_00;
    } while (start_00 != 0x100);
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}